

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

void Gia_ManSwapPos(Gia_Man_t *p,int i)

{
  int iVar1;
  int *piVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  
  if (-1 < i) {
    iVar1 = p->vCos->nSize;
    iVar5 = iVar1 - p->nRegs;
    if (i < iVar5) {
      if (i == 0) {
        return;
      }
      if (iVar5 < 1) {
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if (iVar1 < 1) {
LAB_00243acb:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar2 = p->vCos->pArray;
      iVar5 = *piVar2;
      lVar7 = (long)iVar5;
      if ((lVar7 < 0) || (p->nObjs <= iVar5)) {
LAB_00243a8d:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = p->pObjs;
      uVar4 = (uint)*(ulong *)(pGVar3 + lVar7);
      iVar6 = iVar5 - (uVar4 & 0x1fffffff);
      if (-1 < iVar6) {
        if (iVar1 <= i) goto LAB_00243acb;
        iVar1 = piVar2[(uint)i];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_00243a8d;
        iVar8 = iVar1 - (*(uint *)(pGVar3 + iVar1) & 0x1fffffff);
        if (-1 < iVar8) {
          if (iVar8 < iVar5) {
            *(ulong *)(pGVar3 + lVar7) =
                 (ulong)(*(uint *)(pGVar3 + iVar1) & 0x20000000 | iVar5 - iVar8 & 0x1fffffffU) |
                 *(ulong *)(pGVar3 + lVar7) & 0xffffffffc0000000;
            if (p->vCos->nSize <= i) goto LAB_00243acb;
            iVar1 = p->vCos->pArray[(uint)i];
            lVar7 = (long)iVar1;
            if ((lVar7 < 0) || (p->nObjs <= iVar1)) goto LAB_00243a8d;
            if (iVar6 < iVar1) {
              *(ulong *)(p->pObjs + lVar7) =
                   (ulong)(uVar4 & 0x20000000 | iVar1 - iVar6 & 0x1fffffffU) |
                   *(ulong *)(p->pObjs + lVar7) & 0xffffffffc0000000;
              return;
            }
          }
          __assert_fail("Gia_ObjId(p, pObjCo) > Abc_Lit2Var(iLit0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x36e,"void Gia_ManPatchCoDriver(Gia_Man_t *, int, int)");
        }
      }
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
  }
  __assert_fail("i >= 0 && i < Gia_ManPoNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                ,0x694,"void Gia_ManSwapPos(Gia_Man_t *, int)");
}

Assistant:

void Gia_ManSwapPos( Gia_Man_t * p, int i )
{
    int Lit0, LitI;
    assert( i >= 0 && i < Gia_ManPoNum(p) );
    if ( i == 0 )
        return;
    Lit0 = Gia_ObjFaninLit0p( p, Gia_ManPo(p, 0) );
    LitI = Gia_ObjFaninLit0p( p, Gia_ManPo(p, i) );
    Gia_ManPatchCoDriver( p, 0, LitI );
    Gia_ManPatchCoDriver( p, i, Lit0 );
}